

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void insert_flipped_container
               (roaring_array_t *ans_arr,roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,
               uint16_t lb_end)

{
  int iVar1;
  container_t *pcVar2;
  container_t *container_to_flip;
  container_t *flipped_container;
  int32_t local_28;
  uint8_t ctype_out;
  int32_t iStack_24;
  uint8_t ctype_in;
  int j;
  int i;
  uint16_t lb_end_local;
  uint16_t lb_start_local;
  roaring_array_t *prStack_18;
  uint16_t hb_local;
  roaring_array_t *x1_arr_local;
  roaring_array_t *ans_arr_local;
  
  j._2_2_ = lb_end;
  i._0_2_ = lb_start;
  i._2_2_ = hb;
  prStack_18 = x1_arr;
  x1_arr_local = ans_arr;
  iStack_24 = ra_get_index(x1_arr,hb);
  local_28 = ra_get_index(x1_arr_local,i._2_2_);
  if (iStack_24 < 0) {
    pcVar2 = container_range_of_ones
                       ((uint)(uint16_t)i,j._2_2_ + 1,(uint8_t *)((long)&flipped_container + 6));
    ra_insert_new_key_value_at(x1_arr_local,-1 - local_28,i._2_2_,pcVar2,flipped_container._6_1_);
  }
  else {
    pcVar2 = ra_get_container_at_index
                       (prStack_18,(uint16_t)iStack_24,(uint8_t *)((long)&flipped_container + 7));
    pcVar2 = container_not_range(pcVar2,flipped_container._7_1_,(uint)(uint16_t)i,j._2_2_ + 1,
                                 (uint8_t *)((long)&flipped_container + 6));
    iVar1 = container_get_cardinality(pcVar2,flipped_container._6_1_);
    if (iVar1 == 0) {
      container_free(pcVar2,flipped_container._6_1_);
    }
    else {
      ra_insert_new_key_value_at(x1_arr_local,-1 - local_28,i._2_2_,pcVar2,flipped_container._6_1_);
    }
  }
  return;
}

Assistant:

static void insert_flipped_container(roaring_array_t *ans_arr,
                                     const roaring_array_t *x1_arr, uint16_t hb,
                                     uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    const int j = ra_get_index(ans_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, i, &ctype_in);
        flipped_container =
            container_not_range(container_to_flip, ctype_in, (uint32_t)lb_start,
                                (uint32_t)(lb_end + 1), &ctype_out);

        if (container_get_cardinality(flipped_container, ctype_out))
            ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                       ctype_out);
        else {
            container_free(flipped_container, ctype_out);
        }
    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(ans_arr, -j - 1, hb, flipped_container,
                                   ctype_out);
    }
}